

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitOnceTest_random_vector_Test<char>::TestBody
          (WordSplitOnceTest_random_vector_Test<char> *this)

{
  bool bVar1;
  reference rhs;
  char *pcVar2;
  value_type in_whitespace;
  AssertHelper local_118 [8];
  Message local_110 [8];
  vector<char,_std::allocator<char>_> local_108;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8 [8];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  undefined1 local_b0 [8];
  pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
  split_result;
  RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_> data;
  WordSplitOnceTest_random_vector_Test<char> *this_local;
  
  in_whitespace = '\0';
  data.m_token_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_>::RandomWordTestData
            ((RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_> *)
             &split_result.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
             ,'\0',0,0);
  jessilib::
  word_split_once<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
            ((pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>
              *)local_b0,(jessilib *)&data.m_fixed_word_length,
             (vector<char,_std::allocator<char>_> *)0x0,in_whitespace);
  rhs = std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)&data.m_str.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,0);
  testing::internal::EqHelper::
  Compare<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d0,"split_result.first","data.m_tokens[0]",
             (vector<char,_std::allocator<char>_> *)local_b0,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_>::get_remainder
            (&local_108,
             (RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_> *)
             &split_result.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
             ,1);
  testing::internal::EqHelper::
  Compare<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_f0,"split_result.second","data.get_remainder(1)",
             (vector<char,_std::allocator<char>_> *)
             &split_result.first.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             &local_108);
  std::vector<char,_std::allocator<char>_>::~vector(&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(local_118,local_110);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>::
  ~pair((pair<std::vector<char,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_> *
        )local_b0);
  RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_>::~RandomWordTestData
            ((RandomWordTestData<char,_std::vector<char,_std::allocator<char>_>_> *)
             &split_result.second.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
            );
  return;
}

Assistant:

TYPED_TEST(WordSplitOnceTest, random_vector) {
	using vector_type = std::vector<TypeParam>;
	RandomWordTestData<TypeParam, vector_type> data{};
	std::pair<vector_type, vector_type> split_result = word_split_once<vector_type>(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}